

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::ProjectionLight::Phi(ProjectionLight *this,SampledWavelengths *lambda)

{
  bool bVar1;
  float fVar2;
  undefined1 auVar3 [16];
  RGB *pRVar4;
  Tuple2<pbrt::Point2,_int> TVar5;
  int iVar6;
  int c;
  int c_00;
  Point2i p;
  float fVar7;
  undefined1 auVar8 [16];
  float fVar9;
  Float FVar10;
  undefined1 auVar11 [16];
  undefined1 extraout_var [56];
  undefined1 auVar12 [56];
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar16 [56];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  SampledSpectrum SVar19;
  undefined1 local_98 [8];
  undefined1 local_90 [16];
  SampledWavelengths *local_80;
  ulong local_78;
  ulong local_70;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  RGBSpectrum local_58;
  undefined1 auVar15 [64];
  
  TVar5 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
  iVar6 = TVar5.y;
  if (iVar6 < 1) {
    auVar8 = ZEXT816(0);
  }
  else {
    auVar17 = ZEXT864(0);
    local_90._8_8_ = 0;
    local_80 = lambda;
    do {
      if (0 < TVar5.x) {
        iVar6 = (int)local_90._8_8_;
        local_78 = local_90._8_8_ << 0x20;
        local_70 = 0;
        do {
          _local_68 = auVar17._0_16_;
          auVar18 = ZEXT816(0) << 0x40;
          fVar9 = ((float)(int)local_70 + 0.5) / (float)TVar5.x;
          fVar13 = ((float)iVar6 + 0.5) / (float)TVar5.y;
          auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * (this->screenBounds).pMax.
                                                          super_Tuple2<pbrt::Point2,_float>.x)),
                                   ZEXT416((uint)(1.0 - fVar9)),
                                   ZEXT416((uint)(this->screenBounds).pMin.
                                                 super_Tuple2<pbrt::Point2,_float>.x));
          auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar13 * (this->screenBounds).pMax.
                                                            super_Tuple2<pbrt::Point2,_float>.y)),
                                    ZEXT416((uint)(1.0 - fVar13)),
                                    ZEXT416((uint)(this->screenBounds).pMin.
                                                  super_Tuple2<pbrt::Point2,_float>.y));
          fVar9 = auVar11._0_4_;
          auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * (this->LightFromScreen).m.m[0][1])),
                                    auVar8,ZEXT416((uint)(this->LightFromScreen).m.m[0][0]));
          auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * (this->LightFromScreen).m.m[1][1])),
                                    auVar8,ZEXT416((uint)(this->LightFromScreen).m.m[1][0]));
          auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * (this->LightFromScreen).m.m[2][1])),auVar8
                                   ,ZEXT416((uint)(this->LightFromScreen).m.m[2][0]));
          auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * (this->LightFromScreen).m.m[3][1])),auVar8
                                   ,ZEXT416((uint)(this->LightFromScreen).m.m[3][0]));
          auVar11 = vfmadd231ss_fma(auVar11,auVar18,ZEXT416((uint)(this->LightFromScreen).m.m[0][2])
                                   );
          auVar14 = vfmadd231ss_fma(auVar14,auVar18,ZEXT416((uint)(this->LightFromScreen).m.m[1][2])
                                   );
          auVar3 = vfmadd231ss_fma(auVar3,auVar18,ZEXT416((uint)(this->LightFromScreen).m.m[2][2]));
          auVar8 = vfmadd231ss_fma(auVar8,auVar18,ZEXT416((uint)(this->LightFromScreen).m.m[3][2]));
          fVar9 = auVar8._0_4_ + (this->LightFromScreen).m.m[3][3];
          fVar13 = auVar11._0_4_ + (this->LightFromScreen).m.m[0][3];
          fVar7 = auVar14._0_4_ + (this->LightFromScreen).m.m[1][3];
          fVar2 = auVar3._0_4_ + (this->LightFromScreen).m.m[2][3];
          local_98._0_4_ = 0.0;
          local_98._4_4_ = 0.0;
          local_90._0_4_ = 0.0;
          bVar1 = fVar9 == 1.0;
          p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_78 | local_70);
          c_00 = 0;
          fVar7 = (float)((uint)bVar1 * (int)fVar7 + (uint)!bVar1 * (int)(fVar7 / fVar9));
          auVar8 = ZEXT416((uint)bVar1 * (int)fVar13 + (uint)!bVar1 * (int)(fVar13 / fVar9));
          fVar9 = (float)((uint)bVar1 * (int)fVar2 + (uint)!bVar1 * (int)(fVar2 / fVar9));
          auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar7)),auVar8,auVar8);
          auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar9),ZEXT416((uint)fVar9));
          auVar8 = vsqrtss_avx(auVar8,auVar8);
          auVar17 = ZEXT1664(auVar8);
          fVar9 = fVar9 / auVar8._0_4_;
          do {
            FVar10 = Image::GetChannel(&this->image,p,c_00,(WrapMode2D)0x200000002);
            auVar16 = auVar17._8_56_;
            pRVar4 = (RGB *)local_98;
            if ((c_00 != 0) && (pRVar4 = (RGB *)(local_98 + 4), c_00 != 1)) {
              pRVar4 = (RGB *)local_90;
            }
            c_00 = c_00 + 1;
            pRVar4->r = FVar10;
          } while (c_00 != 3);
          auVar12 = extraout_var;
          RGBSpectrum::RGBSpectrum(&local_58,this->imageColorSpace,(RGB *)local_98);
          SVar19 = RGBSpectrum::Sample(&local_58,local_80);
          auVar15._0_8_ = SVar19.values.values._8_8_;
          auVar15._8_56_ = auVar16;
          auVar17._0_8_ = SVar19.values.values._0_8_;
          auVar17._8_56_ = auVar12;
          auVar8 = vmovlhps_avx(auVar17._0_16_,auVar15._0_16_);
          TVar5 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
          fVar9 = fVar9 * fVar9 * fVar9;
          local_70 = local_70 + 1;
          auVar17 = ZEXT1664(CONCAT412(fVar9 * auVar8._12_4_ + fStack_5c,
                                       CONCAT48(fVar9 * auVar8._8_4_ + fStack_60,
                                                CONCAT44(fVar9 * auVar8._4_4_ +
                                                         (float)local_68._4_4_,
                                                         fVar9 * auVar8._0_4_ +
                                                         (float)local_68._0_4_))));
        } while ((long)local_70 < (long)TVar5.x);
      }
      auVar8 = auVar17._0_16_;
      local_90._8_8_ = local_90._8_8_ + 1;
    } while ((long)local_90._8_8_ < (long)TVar5 >> 0x20);
    iVar6 = TVar5.y;
  }
  fVar9 = this->scale * this->A;
  auVar14._0_4_ = (float)(TVar5.x * iVar6);
  auVar11._0_4_ = fVar9 * auVar8._0_4_;
  auVar11._4_4_ = fVar9 * auVar8._4_4_;
  auVar11._8_4_ = fVar9 * auVar8._8_4_;
  auVar11._12_4_ = fVar9 * auVar8._12_4_;
  auVar14._4_4_ = auVar14._0_4_;
  auVar14._8_4_ = auVar14._0_4_;
  auVar14._12_4_ = auVar14._0_4_;
  auVar8 = vdivps_avx(auVar11,auVar14);
  auVar11 = vshufpd_avx(auVar8,auVar8,1);
  SVar19.values.values._0_8_ = auVar8._0_8_;
  SVar19.values.values._8_8_ = auVar11._0_8_;
  return (SampledSpectrum)SVar19.values.values;
}

Assistant:

SampledSpectrum ProjectionLight::Phi(const SampledWavelengths &lambda) const {
    SampledSpectrum sum(0.f);
    for (int v = 0; v < image.Resolution().y; ++v)
        for (int u = 0; u < image.Resolution().x; ++u) {
            Point2f ps = screenBounds.Lerp(
                {(u + .5f) / image.Resolution().x, (v + .5f) / image.Resolution().y});
            Vector3f w = Vector3f(LightFromScreen(Point3f(ps.x, ps.y, 0)));
            w = Normalize(w);
            Float dwdA = Pow<3>(w.z);

            RGB rgb;
            for (int c = 0; c < 3; ++c)
                rgb[c] = image.GetChannel({u, v}, c);

            SampledSpectrum L = RGBSpectrum(*imageColorSpace, rgb).Sample(lambda);

            sum += L * dwdA;
        }

    return scale * A * sum / (image.Resolution().x * image.Resolution().y);
}